

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O1

void Sim_UtilCountPairsAllPrint(Sym_Man_t *p)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  timespec ts;
  timespec local_30;
  
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  if (0 < p->nOutputs) {
    uVar4 = 0;
    do {
      printf("Output %2d :",uVar4 & 0xffffffff);
      if ((long)p->vMatrSymms->nSize <= (long)uVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if ((long)p->vSupports->nSize <= (long)uVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                      ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
      }
      Sim_UtilCountPairsOnePrint
                ((Extra_BitMat_t *)p->vMatrSymms->pArray[uVar4],
                 (Vec_Int_t *)p->vSupports->pArray[uVar4]);
      putchar(10);
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)p->nOutputs);
  }
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  p->timeCount = p->timeCount + lVar3 + lVar2;
  return;
}

Assistant:

void Sim_UtilCountPairsAllPrint( Sym_Man_t * p )
{
    int i;
    abctime clk;
clk = Abc_Clock();
    for ( i = 0; i < p->nOutputs; i++ )
    {
        printf( "Output %2d :", i );
        Sim_UtilCountPairsOnePrint( (Extra_BitMat_t *)Vec_PtrEntry(p->vMatrSymms, i), Vec_VecEntryInt(p->vSupports, i) );
        printf( "\n" );
    }
p->timeCount += Abc_Clock() - clk;
}